

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::Stmt::add_scope_variable(Stmt *this,string *name,string *value,bool is_var,bool override)

{
  string *__args;
  bool local_81;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  _Self local_38;
  _Self local_30;
  undefined1 local_22;
  bool local_21;
  bool override_local;
  string *psStack_20;
  bool is_var_local;
  string *value_local;
  string *name_local;
  Stmt *this_local;
  
  local_81 = true;
  local_22 = override;
  local_21 = is_var;
  psStack_20 = value;
  value_local = name;
  name_local = (string *)this;
  if (!override) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::find(&this->scope_context_,name);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end(&this->scope_context_);
    local_81 = std::operator==(&local_30,&local_38);
  }
  __args = value_local;
  if (local_81 != false) {
    std::make_pair<bool&,std::__cxx11::string_const&>(&local_60,&local_21,psStack_20);
    std::
    map<std::__cxx11::string,std::pair<bool,std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>>
    ::emplace<std::__cxx11::string_const&,std::pair<bool,std::__cxx11::string>>
              ((map<std::__cxx11::string,std::pair<bool,std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>>
                *)&this->scope_context_,__args,&local_60);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair(&local_60);
  }
  return;
}

Assistant:

void Stmt::add_scope_variable(const std::string &name, const std::string &value, bool is_var,
                              bool override) {
    if (override || scope_context_.find(name) == scope_context_.end()) {
        scope_context_.emplace(name, std::make_pair(is_var, value));
    }
}